

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in.c
# Opt level: O3

LY_ERR ly_in_new_file(FILE *f,ly_in **in)

{
  ly_in *plVar1;
  int fd;
  LY_ERR LVar2;
  char *pcVar3;
  
  if (f == (FILE *)0x0) {
    pcVar3 = "f";
  }
  else {
    if (in != (ly_in **)0x0) {
      fd = fileno((FILE *)f);
      LVar2 = ly_in_new_fd(fd,in);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      plVar1 = *in;
      plVar1->type = LY_IN_FILE;
      (plVar1->method).f = f;
      return LY_SUCCESS;
    }
    pcVar3 = "in";
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar3,"ly_in_new_file");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_in_new_file(FILE *f, struct ly_in **in)
{
    LY_CHECK_ARG_RET(NULL, f, in, LY_EINVAL);

    LY_CHECK_RET(ly_in_new_fd(fileno(f), in));

    /* convert the LY_IN_FD input handler into the LY_IN_FILE */
    (*in)->type = LY_IN_FILE;
    (*in)->method.f = f;

    return LY_SUCCESS;
}